

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O2

void __thiscall qpdf::Tokenizer::inStringEscape(Tokenizer *this,char ch)

{
  int iVar1;
  undefined7 in_register_00000031;
  char cVar2;
  
  this->state = st_in_string;
  iVar1 = (int)CONCAT71(in_register_00000031,ch);
  if (iVar1 - 0x30U < 8) {
    this->state = st_char_code;
    this->char_code = 0;
    this->digit_count = 0;
    inCharCode(this,ch);
    return;
  }
  if (iVar1 != 10) {
    if (iVar1 != 0xd) {
      cVar2 = (char)this + '\x10';
      if ((((iVar1 != 0x62) && (iVar1 != 0x66)) && (iVar1 != 0x6e)) &&
         ((iVar1 != 0x72 && (iVar1 != 0x74)))) {
        std::__cxx11::string::push_back(cVar2);
        return;
      }
      std::__cxx11::string::push_back(cVar2);
      return;
    }
    this->state = st_string_after_cr;
  }
  return;
}

Assistant:

void
Tokenizer::inStringEscape(char ch)
{
    state = st_in_string;
    switch (ch) {
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
        state = st_char_code;
        char_code = 0;
        digit_count = 0;
        inCharCode(ch);
        return;

    case 'n':
        val += '\n';
        return;

    case 'r':
        val += '\r';
        return;

    case 't':
        val += '\t';
        return;

    case 'b':
        val += '\b';
        return;

    case 'f':
        val += '\f';
        return;

    case '\n':
        return;

    case '\r':
        state = st_string_after_cr;
        return;

    default:
        // PDF spec says backslash is ignored before anything else
        val += ch;
        return;
    }
}